

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Account::deposit_amount(Account *this,float x)

{
  while (x <= 0.0) {
    std::operator<<((ostream *)&std::cout,"\n Enter a positive value:\t");
    std::istream::_M_extract<float>((float *)&std::cin);
  }
  this->deposit = x + this->deposit;
  return;
}

Assistant:

void Account::deposit_amount(float x)
{
    /*!
     * It helps to deposit money into account by amount x
     */
    while (x <= 0){
        std::cout << "\n Enter a positive value:\t";
        std::cin >> x;
    }
    deposit+=x;
}